

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

void xmlNextChar(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  byte *pbVar2;
  ushort uVar3;
  int iVar4;
  uint val;
  int c;
  size_t avail;
  uchar *cur;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt != (xmlParserCtxtPtr)0x0) && (ctxt->input != (xmlParserInputPtr)0x0)) {
    _val = (long)ctxt->input->end - (long)ctxt->input->cur;
    if (_val < 0xfa) {
      xmlParserGrow(ctxt);
      if (ctxt->input->end <= ctxt->input->cur) {
        return;
      }
      _val = (long)ctxt->input->end - (long)ctxt->input->cur;
    }
    pbVar2 = ctxt->input->cur;
    bVar1 = *pbVar2;
    if (bVar1 < 0x80) {
      if (bVar1 == 10) {
        ctxt->input->cur = ctxt->input->cur + 1;
        ctxt->input->line = ctxt->input->line + 1;
        ctxt->input->col = 1;
      }
      else if (bVar1 == 0xd) {
        iVar4 = 1;
        if (pbVar2[1] == 10) {
          iVar4 = 2;
        }
        ctxt->input->cur = ctxt->input->cur + iVar4;
        ctxt->input->line = ctxt->input->line + 1;
        ctxt->input->col = 1;
      }
      else {
        ctxt->input->cur = ctxt->input->cur + 1;
        ctxt->input->col = ctxt->input->col + 1;
      }
    }
    else {
      ctxt->input->col = ctxt->input->col + 1;
      if ((1 < _val) && ((pbVar2[1] & 0xc0) == 0x80)) {
        if (bVar1 < 0xe0) {
          if (0xc1 < bVar1) {
            ctxt->input->cur = ctxt->input->cur + 2;
            return;
          }
        }
        else {
          uVar3 = CONCAT11(bVar1,pbVar2[1]);
          if ((2 < _val) && ((pbVar2[2] & 0xc0) == 0x80)) {
            if (bVar1 < 0xf0) {
              if ((0xe09f < uVar3) && ((uVar3 < 0xeda0 || (0xedff < uVar3)))) {
                ctxt->input->cur = ctxt->input->cur + 3;
                return;
              }
            }
            else if ((((3 < _val) && ((pbVar2[3] & 0xc0) == 0x80)) && (0xf08f < uVar3)) &&
                    (uVar3 < 0xf490)) {
              ctxt->input->cur = ctxt->input->cur + 4;
              return;
            }
          }
        }
      }
      if ((ctxt->input->flags & 0x20U) == 0) {
        xmlCtxtErrIO(ctxt,0x51,(char *)0x0);
        ctxt->input->flags = ctxt->input->flags | 0x20;
      }
      ctxt->input->cur = ctxt->input->cur + 1;
    }
  }
  return;
}

Assistant:

void
xmlNextChar(xmlParserCtxtPtr ctxt)
{
    const unsigned char *cur;
    size_t avail;
    int c;

    if ((ctxt == NULL) || (ctxt->input == NULL))
        return;

    avail = ctxt->input->end - ctxt->input->cur;

    if (avail < INPUT_CHUNK) {
        xmlParserGrow(ctxt);
        if (ctxt->input->cur >= ctxt->input->end)
            return;
        avail = ctxt->input->end - ctxt->input->cur;
    }

    cur = ctxt->input->cur;
    c = *cur;

    if (c < 0x80) {
        if (c == '\n') {
            ctxt->input->cur++;
            ctxt->input->line++;
            ctxt->input->col = 1;
        } else if (c == '\r') {
            /*
             *   2.11 End-of-Line Handling
             *   the literal two-character sequence "#xD#xA" or a standalone
             *   literal #xD, an XML processor must pass to the application
             *   the single character #xA.
             */
            ctxt->input->cur += ((cur[1] == '\n') ? 2 : 1);
            ctxt->input->line++;
            ctxt->input->col = 1;
            return;
        } else {
            ctxt->input->cur++;
            ctxt->input->col++;
        }
    } else {
        ctxt->input->col++;

        if ((avail < 2) || (cur[1] & 0xc0) != 0x80)
            goto encoding_error;

        if (c < 0xe0) {
            /* 2-byte code */
            if (c < 0xc2)
                goto encoding_error;
            ctxt->input->cur += 2;
        } else {
            unsigned int val = (c << 8) | cur[1];

            if ((avail < 3) || (cur[2] & 0xc0) != 0x80)
                goto encoding_error;

            if (c < 0xf0) {
                /* 3-byte code */
                if ((val < 0xe0a0) || ((val >= 0xeda0) && (val < 0xee00)))
                    goto encoding_error;
                ctxt->input->cur += 3;
            } else {
                if ((avail < 4) || ((cur[3] & 0xc0) != 0x80))
                    goto encoding_error;

                /* 4-byte code */
                if ((val < 0xf090) || (val >= 0xf490))
                    goto encoding_error;
                ctxt->input->cur += 4;
            }
        }
    }

    return;

encoding_error:
    /* Only report the first error */
    if ((ctxt->input->flags & XML_INPUT_ENCODING_ERROR) == 0) {
        xmlCtxtErrIO(ctxt, XML_ERR_INVALID_ENCODING, NULL);
        ctxt->input->flags |= XML_INPUT_ENCODING_ERROR;
    }
    ctxt->input->cur++;
}